

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t psa_generate_random(uint8_t *output,size_t output_size)

{
  int iVar1;
  psa_status_t pVar2;
  size_t sStack_20;
  int ret;
  size_t output_size_local;
  uint8_t *output_local;
  
  sStack_20 = output_size;
  output_size_local = (size_t)output;
  if ((global_data._1392_1_ & 1) == 0) {
    output_local._4_4_ = -0x89;
  }
  else {
    for (; 0x400 < sStack_20; sStack_20 = sStack_20 - 0x400) {
      iVar1 = mbedtls_ctr_drbg_random(&global_data.ctr_drbg,(uchar *)output_size_local,0x400);
      if (iVar1 != 0) {
        pVar2 = mbedtls_to_psa_error(iVar1);
        return pVar2;
      }
      output_size_local = output_size_local + 0x400;
    }
    iVar1 = mbedtls_ctr_drbg_random(&global_data.ctr_drbg,(uchar *)output_size_local,sStack_20);
    output_local._4_4_ = mbedtls_to_psa_error(iVar1);
  }
  return output_local._4_4_;
}

Assistant:

psa_status_t psa_generate_random( uint8_t *output,
                                  size_t output_size )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    GUARD_MODULE_INITIALIZED;

    while( output_size > MBEDTLS_CTR_DRBG_MAX_REQUEST )
    {
        ret = mbedtls_ctr_drbg_random( &global_data.ctr_drbg,
                                       output,
                                       MBEDTLS_CTR_DRBG_MAX_REQUEST );
        if( ret != 0 )
            return( mbedtls_to_psa_error( ret ) );
        output += MBEDTLS_CTR_DRBG_MAX_REQUEST;
        output_size -= MBEDTLS_CTR_DRBG_MAX_REQUEST;
    }

    ret = mbedtls_ctr_drbg_random( &global_data.ctr_drbg, output, output_size );
    return( mbedtls_to_psa_error( ret ) );
}